

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  long *local_50 [2];
  long local_40 [2];
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,color.data_,color.data_ + color.size_);
    std::__cxx11::string::operator=
              ((string *)((this->colors_)._M_elems + (int)color_level),(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[static_cast<size_t>(color_level)] = to_string_(color);
}